

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpFileInfo.c
# Opt level: O3

int UpnpFileInfo_set_ContentType(UpnpFileInfo *p,char *s)

{
  char *pcVar1;
  
  pcVar1 = (char *)ixmlCloneDOMString(s);
  if (pcVar1 != (char *)0x0) {
    ixmlFreeDOMString(p->m_ContentType);
    p->m_ContentType = pcVar1;
  }
  return (uint)(pcVar1 != (char *)0x0);
}

Assistant:

int UpnpFileInfo_set_ContentType(UpnpFileInfo *p, const DOMString s)
{
	DOMString q = ixmlCloneDOMString(s);
	if (!q)
		return 0;
	ixmlFreeDOMString(p->m_ContentType);
	p->m_ContentType = q;

	return 1;
}